

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

size_t mpack_expect_key_uint(mpack_reader_t *reader,_Bool *found,size_t count)

{
  uint64_t uVar1;
  mpack_tag_t mVar2;
  
  if (reader->error == mpack_ok) {
    if (count == 0) {
      reader->error = mpack_error_bug;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_bug);
      }
      count = 0;
    }
    else {
      mVar2 = mpack_peek_tag(reader);
      if (mVar2.type == mpack_type_uint) {
        uVar1 = mpack_expect_u64(reader);
        if (uVar1 < count && reader->error == mpack_ok) {
          if (found[uVar1] == true) {
            reader->error = mpack_error_invalid;
            reader->end = reader->data;
            if (reader->error_fn != (mpack_reader_error_t)0x0) {
              (*reader->error_fn)(reader,mpack_error_invalid);
            }
          }
          else {
            found[uVar1] = true;
            count = uVar1;
          }
        }
      }
      else {
        mpack_discard(reader);
      }
    }
  }
  return count;
}

Assistant:

size_t mpack_expect_key_uint(mpack_reader_t* reader, bool found[], size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    if (count == 0) {
        mpack_break("count cannot be zero; no keys are valid!");
        mpack_reader_flag_error(reader, mpack_error_bug);
        return count;
    }
    mpack_assert(found != NULL, "found cannot be NULL");

    // the key is only recognized if it is an unsigned int
    if (mpack_peek_tag(reader).type != mpack_type_uint) {
        mpack_discard(reader);
        return count;
    }

    // read the key
    uint64_t value = mpack_expect_u64(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // unrecognized keys are fine, we just return count
    if (value >= count)
        return count;

    // check if this key is a duplicate
    if (found[value]) {
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return count;
    }

    found[value] = true;
    return (size_t)value;
}